

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::ExpandStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *new_select_list)

{
  ClientContext *context;
  pointer pVVar1;
  pointer puVar2;
  _Alloc_hider __p;
  StarExpressionType SVar3;
  bool bVar4;
  int iVar5;
  pointer pPVar6;
  pointer pEVar7;
  type expr_00;
  string *psVar8;
  pointer pRVar9;
  type pPVar10;
  BaseExpression *pBVar11;
  ColumnRefExpression *pCVar12;
  type re;
  LogicalType *pLVar13;
  vector<duckdb::Value,_true> *pvVar14;
  duckdb *this_00;
  iterator iVar15;
  StarExpression *pSVar16;
  reference pvVar17;
  pointer pPVar18;
  ParameterNotResolvedException *this_01;
  BinderException *pBVar19;
  pointer pVVar20;
  ParsedExpression *expr_01;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *expanded_expr;
  pointer puVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr_1;
  ulong __n;
  allocator local_2e9;
  StarExpression *star;
  unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> regex;
  undefined1 local_2d0 [8];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  star_list;
  string err;
  pointer pBStack_280;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  new_list;
  long *local_250;
  string *local_248;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  *local_240;
  optional_ptr<duckdb::ParsedExpression,_true> child_expr;
  Value val;
  string local_1d8;
  string local_1b8 [32];
  string local_198;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118 [32];
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  TableFunctionBinder binder;
  
  TryTransformStarLike(expr);
  star = (StarExpression *)0x0;
  SVar3 = FindStarExpression(this,expr,&star,true,false);
  if (SVar3 == NONE) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)new_select_list,expr);
  }
  else {
    star_list.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    star_list.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    star_list.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_240 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                 *)new_select_list;
    BindContext::GenerateAllColumnExpressions(&this->bind_context,star,&star_list);
    regex.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t.
    super___uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::RE2_*,_std::default_delete<duckdb_re2::RE2>_>.
    super__Head_base<0UL,_duckdb_re2::RE2_*,_false>._M_head_impl =
         (unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>)
         (__uniq_ptr_data<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true,_true>)0x0;
    if ((star->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      TableFunctionBinder::TableFunctionBinder(&binder,this,this->context,&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&star->expr);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_250,pPVar6);
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_2d0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&binder,(LogicalType *)&local_250,false);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_2d0);
      iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar7);
      if ((char)iVar5 == '\0') {
        pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&star->expr);
        iVar5 = (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[6])(pPVar6);
        this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        if ((char)iVar5 != '\0') {
          ParameterNotResolvedException::ParameterNotResolvedException(this_01);
          __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string
                  ((string *)&val,"Unsupported expression in COLUMNS",(allocator *)&err);
        BinderException::BinderException((BinderException *)this_01,(string *)&val);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      context = this->context;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_2d0);
      pVVar20 = (pointer)0x0;
      ExpressionExecutor::EvaluateScalar(&val,context,expr_00,false);
      if (val.type_.id_ == LIST) {
        pLVar13 = ListType::GetChildType(&val.type_);
        if (pLVar13->id_ != VARCHAR) goto LAB_0128e285;
        if (val.is_null != false) {
LAB_0128e2de:
          ::std::__cxx11::string::string
                    (local_1b8,"Star expression \"%s\" resulted in an empty set of columns",
                     (allocator *)&new_list);
          (*(star->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[8])(&local_1d8)
          ;
          StringUtil::Format<std::__cxx11::string>
                    (&err,(StringUtil *)local_1b8,&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar20);
          ::std::__cxx11::string::~string((string *)&local_1d8);
          ::std::__cxx11::string::~string(local_1b8);
          pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>(pBVar19,&star->super_ParsedExpression,&err);
          __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar14 = ListValue::GetChildren(&val);
        pVVar20 = (pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pVVar20 ==
            (pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_0128e2de;
        pvVar14 = ListValue::GetChildren(&val);
        child_expr.ptr = (ParsedExpression *)0x0;
        err._M_dataplus._M_p = (pointer)&pBStack_280;
        err._M_string_length = 1;
        paVar22 = &err.field_2;
        err.field_2._M_allocated_capacity = 0;
        err.field_2._8_8_ = 0;
        pBStack_280 = (pointer)0x0;
        pVVar1 = (pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pVVar20 = (pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start;
            puVar2 = star_list.
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish, pVVar20 != pVVar1;
            pVVar20 = pVVar20 + 1) {
          if (pVVar20->is_null == true) {
            pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
            pSVar16 = star;
            ::std::__cxx11::string::string
                      ((string *)&new_list,
                       "Columns expression does not support NULL input parameters",&local_2e9);
            BinderException::BinderException<>
                      (pBVar19,&pSVar16->super_ParsedExpression,(string *)&new_list);
            __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          psVar8 = StringValue::Get_abi_cxx11_(pVVar20);
          ::std::__cxx11::string::string((string *)&new_list,(string *)psVar8);
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,bool>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&err,(string *)&new_list);
          ::std::__cxx11::string::~string((string *)&new_list);
        }
        for (puVar21 = star_list.
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
            puVar21 = puVar21 + 1) {
          this_00 = (duckdb *)
                    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(puVar21);
          GetColumnsStringValue_abi_cxx11_((string *)&new_list,this_00,expr_01);
          iVar15 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&err,(string *)&new_list);
          if (iVar15.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
              ._M_cur != (__node_type *)0x0) {
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&child_expr,puVar21);
            *(undefined1 *)
             ((long)iVar15.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                    ._M_cur + 0x28) = 1;
          }
          ::std::__cxx11::string::~string((string *)&new_list);
        }
        while (paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)paVar22->_M_allocated_capacity,
              paVar22 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          if (*(char *)((long)paVar22 + 0x28) == '\0') {
            pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&new_list,
                       "Column \"%s\" was selected but was not found in the FROM clause",&local_2e9)
            ;
            ::std::__cxx11::string::string
                      ((string *)&local_d8,(string *)(paVar22->_M_local_buf + 8));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar19,(string *)&new_list,&local_d8);
            __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        this_02 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&child_expr;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::_M_move_assign(&star_list.
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ,this_02);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&err);
      }
      else {
        if (val.type_.id_ != VARCHAR) {
LAB_0128e285:
          pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
          pSVar16 = star;
          ::std::__cxx11::string::string
                    ((string *)&err,
                     "COLUMNS expects either a VARCHAR argument (regex) or a LIST of VARCHAR (list of columns)"
                     ,(allocator *)&new_list);
          BinderException::BinderException<>(pBVar19,&pSVar16->super_ParsedExpression,&err);
          __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (val.is_null == true) {
          pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&err,"COLUMNS does not support NULL as regex argument",
                     (allocator *)&new_list);
          BinderException::BinderException(pBVar19,&err);
          __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        psVar8 = StringValue::Get_abi_cxx11_(&val);
        make_uniq<duckdb_re2::RE2,std::__cxx11::string_const&>((duckdb *)&err,psVar8);
        __p = err._M_dataplus;
        err._M_dataplus._M_p = (pointer)0x0;
        ::std::__uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::reset
                  ((__uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_> *)&regex
                   ,(pointer)__p._M_p);
        ::std::unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::~unique_ptr
                  ((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_> *)&err);
        pRVar9 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                           (&regex);
        puVar2 = star_list.
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_248 = psVar8;
        if (pRVar9->error_->_M_string_length != 0) {
          ::std::__cxx11::string::string
                    (local_118,"Failed to compile regex \"%s\": %s",(allocator *)&new_list);
          ::std::__cxx11::string::string((string *)&local_138,(string *)local_248);
          pRVar9 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                   operator->(&regex);
          ::std::__cxx11::string::string((string *)&local_158,(string *)pRVar9->error_);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    (&err,(StringUtil *)local_118,&local_138,&local_158,params_1);
          ::std::__cxx11::string::~string((string *)&local_158);
          ::std::__cxx11::string::~string((string *)&local_138);
          ::std::__cxx11::string::~string(local_118);
          pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>(pBVar19,&star->super_ParsedExpression,&err);
          __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        new_list.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        new_list.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        new_list.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (puVar21 = star_list.
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
            puVar21 = puVar21 + 1) {
          pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(puVar21);
          child_expr = GetResolvedColumnExpression(pPVar10);
          if (child_expr.ptr != (ParsedExpression *)0x0) {
            pBVar11 = &optional_ptr<duckdb::ParsedExpression,_true>::operator->(&child_expr)->
                       super_BaseExpression;
            pCVar12 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar11);
            psVar8 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar12);
            pVVar20 = (pointer)(psVar8->_M_dataplus)._M_p;
            err._M_string_length = psVar8->_M_string_length;
            err._M_dataplus._M_p = (pointer)pVVar20;
            re = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator*
                           (&regex);
            bVar4 = duckdb_re2::RE2::PartialMatch<>((StringPiece *)&err,re);
            if (bVar4) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&new_list,puVar21);
            }
          }
        }
        if (new_list.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            new_list.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::__cxx11::string::string
                    (local_178,"No matching columns found that match regex \"%s\"",
                     (allocator *)&child_expr);
          ::std::__cxx11::string::string((string *)&local_198,(string *)local_248);
          StringUtil::Format<std::__cxx11::string>
                    (&err,(StringUtil *)local_178,&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar20);
          ::std::__cxx11::string::~string((string *)&local_198);
          ::std::__cxx11::string::~string(local_178);
          pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>(pBVar19,&star->super_ParsedExpression,&err);
          __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_02 = &new_list.
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::_M_move_assign(&star_list.
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ,this_02);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(this_02);
      Value::~Value(&val);
      if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)local_2d0
          != (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(_func_int **)local_2d0 + 8))();
      }
      if (local_250 != (long *)0x0) {
        (**(code **)(*local_250 + 8))();
      }
      TableFunctionBinder::~TableFunctionBinder(&binder);
    }
    (*(star->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])(&val);
    pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&val)->super_BaseExpression;
    pSVar16 = BaseExpression::Cast<duckdb::StarExpression>(pBVar11);
    if (SVar3 == UNPACKED) {
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr);
      bVar4 = StarExpression::IsColumnsUnpacked(pPVar10);
      if (bVar4) {
        pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&binder,"*COLUMNS not allowed at the root level, use COLUMNS instead",
                   (allocator *)&err);
        BinderException::BinderException(pBVar19,(string *)&binder);
        __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ReplaceUnpackedStarExpression
                (this,expr,&star_list,pSVar16,
                 (optional_ptr<duckdb_re2::RE2,_true>)
                 regex.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t
                 .super___uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t
                 .super__Tuple_impl<0UL,_duckdb_re2::RE2_*,_std::default_delete<duckdb_re2::RE2>_>.
                 super__Head_base<0UL,_duckdb_re2::RE2_*,_false>._M_head_impl);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                (local_240,expr);
    }
    else {
      for (__n = 0; __n < (ulong)((long)star_list.
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)star_list.
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(expr);
        (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&err,pPVar6);
        pvVar17 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&star_list,__n);
        ReplaceStarExpression
                  ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&err,pvVar17);
        bVar4 = StarExpression::IsColumns(&pSVar16->super_ParsedExpression);
        if (bVar4) {
          pvVar17 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::get<true>(&star_list,__n);
          pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(pvVar17);
          new_list.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)GetResolvedColumnExpression(pPVar10);
          if ((ParsedExpression *)
              new_list.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (ParsedExpression *)0x0) {
            pBVar11 = &optional_ptr<duckdb::ParsedExpression,_true>::operator->
                                 ((optional_ptr<duckdb::ParsedExpression,_true> *)&new_list)->
                       super_BaseExpression;
            pCVar12 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar11);
            pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&err);
            if ((pPVar6->super_BaseExpression).alias._M_string_length == 0) {
              pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&err);
              ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar12);
              ::std::__cxx11::string::_M_assign((string *)&(pPVar6->super_BaseExpression).alias);
            }
            else {
              pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&err);
              pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)&err);
              psVar8 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar12);
              ReplaceColumnsAlias((string *)&binder,&(pPVar18->super_BaseExpression).alias,psVar8,
                                  (optional_ptr<duckdb_re2::RE2,_true>)
                                  regex.
                                  super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb_re2::RE2_*,_std::default_delete<duckdb_re2::RE2>_>
                                  .super__Head_base<0UL,_duckdb_re2::RE2_*,_false>._M_head_impl);
              ::std::__cxx11::string::operator=
                        ((string *)&(pPVar6->super_BaseExpression).alias,(string *)&binder);
              ::std::__cxx11::string::~string((string *)&binder);
            }
          }
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  (local_240,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&err);
        if (err._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)err._M_dataplus._M_p + 8))();
        }
      }
    }
    if ((long *)CONCAT71(val.type_._1_7_,val.type_.id_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(val.type_._1_7_,val.type_.id_) + 8))();
    }
    ::std::unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::~unique_ptr
              (&regex.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&star_list.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
  }
  return;
}

Assistant:

void Binder::ExpandStarExpression(unique_ptr<ParsedExpression> expr,
                                  vector<unique_ptr<ParsedExpression>> &new_select_list) {
	TryTransformStarLike(expr);

	StarExpression *star = nullptr;

	//! Check the current 'expr' to find out if it contains a star-expression
	//! that needs to be expanded
	auto star_type = FindStarExpression(expr, &star, true, false);
	if (star_type == StarExpressionType::NONE) {
		// no star expression: add it as-is
		D_ASSERT(!star);
		new_select_list.push_back(std::move(expr));
		return;
	}
	D_ASSERT(star);
	vector<unique_ptr<ParsedExpression>> star_list;
	//! Expand the star that we found into a new list of expressions
	bind_context.GenerateAllColumnExpressions(*star, star_list);

	unique_ptr<duckdb_re2::RE2> regex;
	if (star->expr) {
		// COLUMNS with an expression
		// two options:
		// VARCHAR parameter <- this is a regular expression
		// LIST of VARCHAR parameters <- this is a set of columns
		TableFunctionBinder binder(*this, context);
		auto child = star->expr->Copy();
		auto result = binder.Bind(child);
		if (!result->IsFoldable()) {
			// cannot resolve parameters here
			if (star->expr->HasParameter()) {
				throw ParameterNotResolvedException();
			} else {
				throw BinderException("Unsupported expression in COLUMNS");
			}
		}
		auto val = ExpressionExecutor::EvaluateScalar(context, *result);
		if (val.type().id() == LogicalTypeId::VARCHAR) {
			// regex
			if (val.IsNull()) {
				throw BinderException("COLUMNS does not support NULL as regex argument");
			}
			auto &regex_str = StringValue::Get(val);
			regex = make_uniq<duckdb_re2::RE2>(regex_str);
			if (!regex->error().empty()) {
				auto err = StringUtil::Format("Failed to compile regex \"%s\": %s", regex_str, regex->error());
				throw BinderException(*star, err);
			}
			vector<unique_ptr<ParsedExpression>> new_list;
			for (auto &expanded_expr : star_list) {
				auto child_expr = GetResolvedColumnExpression(*expanded_expr);
				if (!child_expr) {
					continue;
				}
				auto &colref = child_expr->Cast<ColumnRefExpression>();
				if (!RE2::PartialMatch(colref.GetColumnName(), *regex)) {
					continue;
				}
				new_list.push_back(std::move(expanded_expr));
			}
			if (new_list.empty()) {
				auto err = StringUtil::Format("No matching columns found that match regex \"%s\"", regex_str);
				throw BinderException(*star, err);
			}
			star_list = std::move(new_list);
		} else if (val.type().id() == LogicalTypeId::LIST &&
		           ListType::GetChildType(val.type()).id() == LogicalTypeId::VARCHAR) {
			// list of varchar columns
			if (val.IsNull() || ListValue::GetChildren(val).empty()) {
				auto err =
				    StringUtil::Format("Star expression \"%s\" resulted in an empty set of columns", star->ToString());
				throw BinderException(*star, err);
			}
			auto &children = ListValue::GetChildren(val);
			vector<unique_ptr<ParsedExpression>> new_list;
			// scan the list for all selected columns and construct a lookup table
			case_insensitive_map_t<bool> selected_set;
			for (auto &child : children) {
				if (child.IsNull()) {
					throw BinderException(*star, "Columns expression does not support NULL input parameters");
				}
				selected_set.insert(make_pair(StringValue::Get(child), false));
			}
			// now check the list of all possible expressions and select which ones make it in
			for (auto &expr : star_list) {
				auto str = GetColumnsStringValue(*expr);
				auto entry = selected_set.find(str);
				if (entry != selected_set.end()) {
					new_list.push_back(std::move(expr));
					entry->second = true;
				}
			}
			// check if all expressions found a match
			for (auto &entry : selected_set) {
				if (!entry.second) {
					throw BinderException("Column \"%s\" was selected but was not found in the FROM clause",
					                      entry.first);
				}
			}
			star_list = std::move(new_list);
		} else {
			throw BinderException(
			    *star, "COLUMNS expects either a VARCHAR argument (regex) or a LIST of VARCHAR (list of columns)");
		}
	}
	//! We make a copy because we will be replacing the original star
	//! If we have identical stars that also need to be replaced
	//! This causes a heap-use-after-free or other corruption if we don't make a copy to reference instead.
	auto copied_star_p = star->Copy();
	auto &copied_star = copied_star_p->Cast<StarExpression>();

	// now perform the replacement
	if (star_type == StarExpressionType::UNPACKED) {
		if (StarExpression::IsColumnsUnpacked(*expr)) {
			throw BinderException("*COLUMNS not allowed at the root level, use COLUMNS instead");
		}
		ReplaceUnpackedStarExpression(expr, star_list, copied_star, regex.get());
		new_select_list.push_back(std::move(expr));
		return;
	}
	for (idx_t i = 0; i < star_list.size(); i++) {
		auto new_expr = expr->Copy();
		ReplaceStarExpression(new_expr, star_list[i]);
		if (StarExpression::IsColumns(copied_star)) {
			auto expr = GetResolvedColumnExpression(*star_list[i]);
			if (expr) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (new_expr->GetAlias().empty()) {
					new_expr->SetAlias(colref.GetColumnName());
				} else {
					new_expr->SetAlias(ReplaceColumnsAlias(new_expr->GetAlias(), colref.GetColumnName(), regex.get()));
				}
			}
		}
		new_select_list.push_back(std::move(new_expr));
	}
}